

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int print_gau_cnt(char *fn)

{
  int iVar1;
  cmd_ln_t *cmdln;
  long lVar2;
  double local_c8;
  char local_a8 [4];
  int32 sf;
  char mv_fmt [64];
  int local_5c;
  uint local_58;
  int32 pass2var;
  uint32 l;
  uint32 k;
  uint32 j;
  uint32 i;
  uint32 *veclen;
  uint local_38;
  uint32 n_density;
  uint32 n_feat;
  uint32 n_mgau;
  float32 ***dnom;
  vector_t ***wt_var;
  vector_t ***wt_mean;
  char *fn_local;
  
  wt_mean = (vector_t ***)fn;
  iVar1 = s3gaucnt_read(fn,&wt_var,(vector_t ****)&dnom,&local_5c,(float32 ****)&n_feat,&n_density,
                        &local_38,(uint32 *)((long)&veclen + 4),(uint32 **)&j);
  if (iVar1 == 0) {
    if (dnom == (float32 ***)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x137,"No variance counts\n");
    }
    if (local_5c != 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/printp/main.c"
              ,0x13a,"-2passvar yes\n");
    }
    cmdln = cmd_ln_get();
    lVar2 = cmd_ln_int_r(cmdln,"-sigfig");
    sprintf(local_a8,"%%.%de,%%.%de ",(ulong)((int)lVar2 - 1),(ulong)((int)lVar2 - 1));
    for (k = 0; k < n_density; k = k + 1) {
      printf("mgau %u\n",(ulong)k);
      for (l = 0; l < local_38; l = l + 1) {
        printf("feature %u\n",(ulong)l);
        for (pass2var = 0; (uint)pass2var < veclen._4_4_; pass2var = pass2var + 1) {
          printf("density %u: ",(ulong)(uint)pass2var);
          printf(e_fmt,(double)(float)_n_feat[k][l][(uint)pass2var]);
          local_58 = 0;
          while( true ) {
            if (_j[l] <= local_58) break;
            if (dnom == (float32 ***)0x0) {
              local_c8 = 0.0;
            }
            else {
              local_c8 = (double)*(float *)(*(long *)(dnom[k][l] + (ulong)(uint)pass2var * 2) +
                                           (ulong)local_58 * 4);
            }
            printf(local_a8,(double)wt_var[k][l][(uint)pass2var][local_58],local_c8);
            local_58 = local_58 + 1;
          }
          printf("\n");
        }
      }
    }
    if (wt_var != (vector_t ***)0x0) {
      ckd_free(***wt_var);
      ckd_free_3d(wt_var);
    }
    if (dnom != (float32 ***)0x0) {
      ckd_free(*(void **)**dnom);
      ckd_free_3d(dnom);
    }
    ckd_free(_j);
    fn_local._4_4_ = 0;
  }
  else {
    fflush(_stdout);
    perror((char *)wt_mean);
    fn_local._4_4_ = -1;
  }
  return fn_local._4_4_;
}

Assistant:

int
print_gau_cnt(const char *fn)
{
    vector_t ***wt_mean;
    vector_t ***wt_var;
    float32  ***dnom;
    uint32 n_mgau;
    uint32 n_feat;
    uint32 n_density;
    uint32 *veclen;
    uint32 i, j, k, l;
    int32 pass2var;
    char mv_fmt[64];
    int32 sf;

    if (s3gaucnt_read(fn,
		      &wt_mean,
		      &wt_var,
		      &pass2var,
		      &dnom,
		      &n_mgau,
		      &n_feat,
		      &n_density,
		      &veclen) != S3_SUCCESS) {
	fflush(stdout);
	perror(fn);
	    
	return S3_ERROR;
    }

    if (wt_var == NULL) {
	E_INFO("No variance counts\n");
    }
    if (pass2var) {
	E_INFO("-2passvar yes\n");
    }

    sf = cmd_ln_int32("-sigfig");

    sprintf(mv_fmt, "%%.%de,%%.%de ", sf-1, sf-1);

    for (i = 0; i < n_mgau; i++) {
	printf("mgau %u\n", i);
	for (j = 0; j < n_feat; j++) {
	    printf("feature %u\n", j);
	    for (k = 0; k < n_density; k++) {
		printf("density %u: ", k);
		
		printf(e_fmt, dnom[i][j][k]);
		for (l = 0; l < veclen[j]; l++) {
		    printf(mv_fmt,
			   wt_mean[i][j][k][l],
			   (wt_var ? wt_var[i][j][k][l] : 0.0));
		}
		printf("\n");
	    }
	}
    }

    if (wt_mean) {
	ckd_free(wt_mean[0][0][0]);
	ckd_free_3d((void ***)wt_mean);
    }

    if (wt_var) {
	ckd_free(wt_var[0][0][0]);
	ckd_free_3d((void ***)wt_var);
    }
    ckd_free(veclen);
    return S3_SUCCESS;
}